

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O3

void deserialize_duplicate_array(void)

{
  char data [13];
  undefined5 local_10;
  undefined3 uStack_b;
  undefined5 uStack_8;
  
  uStack_8 = 0x100;
  local_10 = 0x303b;
  uStack_b = 0x10000;
  invalid_deserialize_test(&local_10,0xd,"duplicate array values");
  return;
}

Assistant:

DEFINE_TEST(deserialize_duplicate_array) {
    // clang-format off
    const char data[] = {
        0x3B, 0x30, // Serial Cookie
        0, 0,       // Container count - 1
        0,          // Run Flag Bitset (no runs)
        0, 0,       // Upper 16 bits of the first container
        1, 0,       // Cardinality - 1 of the first container
        1, 0,       // first value of first container
        0, 0,       // second value of first container (LESS THAN FIRST)
    };
    // clang-format on
    invalid_deserialize_test(data, sizeof(data), "duplicate array values");
}